

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecFunction(Parser *this,string *msg,bool emptyAllowed)

{
  bool bVar1;
  int iVar2;
  pointer pTVar3;
  pointer this_00;
  enact *this_01;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *cloneables;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> local_b0;
  allocator<char> local_a1;
  string local_a0 [32];
  undefined1 local_80 [8];
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> returnTypename;
  unique_ptr<const_enact::TupleTypename,_std::default_delete<const_enact::TupleTypename>_> local_70;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  local_68;
  undefined1 local_50 [8];
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  parameterTypenames;
  bool emptyAllowed_local;
  string *msg_local;
  Parser *this_local;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *typename_;
  
  expectTypenamePrecUnary(this,msg,emptyAllowed);
  bVar1 = consume((Parser *)msg,EQUAL_GREATER);
  if (bVar1) {
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::vector((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
              *)local_50);
    pTVar3 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
             operator->((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                         *)this);
    iVar2 = (*pTVar3->_vptr_Typename[3])();
    if (iVar2 == 3) {
      std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
      unique_ptr(&returnTypename,
                 (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
                 this);
      static_unique_ptr_cast<enact::TupleTypename_const,enact::Typename_const>
                ((enact *)&local_70,&returnTypename);
      this_00 = std::
                unique_ptr<const_enact::TupleTypename,_std::default_delete<const_enact::TupleTypename>_>
                ::operator->(&local_70);
      this_01 = (enact *)TupleTypename::elementTypenames(this_00);
      cloneAll<enact::Typename_const>(&local_68,this_01,cloneables);
      std::
      vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ::operator=((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                   *)local_50,&local_68);
      std::
      vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ::~vector(&local_68);
      std::unique_ptr<const_enact::TupleTypename,_std::default_delete<const_enact::TupleTypename>_>
      ::~unique_ptr(&local_70);
      std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
      ~unique_ptr(&returnTypename);
    }
    else {
      std::
      vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
      ::push_back((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                   *)local_50,(value_type *)this);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_a0,"Expected return typename after \'=>\'.",&local_a1);
    expectTypename((Parser *)local_80,msg,SUB81(local_a0,0));
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::
    make_unique<enact::FunctionTypename,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>>
              (&local_b0,
               (vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                *)local_80);
    std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::operator=
              ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *)this,
               (unique_ptr<enact::FunctionTypename,_std::default_delete<enact::FunctionTypename>_> *
               )&local_b0);
    std::unique_ptr<enact::FunctionTypename,_std::default_delete<enact::FunctionTypename>_>::
    ~unique_ptr((unique_ptr<enact::FunctionTypename,_std::default_delete<enact::FunctionTypename>_>
                 *)&local_b0);
    std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
              ((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               local_80);
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::~vector((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
               *)local_50);
  }
  return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecFunction(const std::string& msg, bool emptyAllowed) {
        std::unique_ptr<const Typename> typename_ = expectTypenamePrecUnary(msg, emptyAllowed);

        if (consume(TokenType::EQUAL_GREATER)) {
            std::vector<std::unique_ptr<const Typename>> parameterTypenames;
            if (typename_->kind() == Typename::Kind::TUPLE) {
                parameterTypenames = cloneAll(
                        static_unique_ptr_cast<const TupleTypename>(
                                std::move(typename_))
                                ->elementTypenames());
            } else {
                parameterTypenames.push_back(std::move(typename_));
            }

            std::unique_ptr<const Typename> returnTypename =
                    expectTypename("Expected return typename after '=>'.");

            typename_ = std::make_unique<FunctionTypename>(std::move(returnTypename), std::move(parameterTypenames));
        }

        return typename_;
    }